

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::EndColumns(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiOldColumns *pIVar3;
  ImGuiOldColumns *pIVar4;
  ImGuiOldColumnData *pIVar5;
  ImGuiCol idx;
  ImVec2 IVar6;
  bool bVar7;
  ImU32 col;
  int iVar8;
  int column_index;
  long lVar9;
  ulong uVar10;
  ImGuiID id;
  uint uVar11;
  float fVar12;
  undefined1 auVar13 [12];
  float fVar14;
  bool held;
  bool hovered;
  ImGuiContext *g;
  ImRect column_hit_rect;
  bool local_a6;
  bool local_a5;
  uint local_a4;
  ulong local_a0;
  ImGuiContext *local_98;
  float local_8c;
  ImVec2 local_88;
  ImVec2 local_80;
  ImRect local_78;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  local_98 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar3->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge(&pIVar3->Splitter,pIVar2->DrawList);
  }
  local_a4 = pIVar3->Flags;
  fVar12 = (pIVar2->DC).CursorPos.y;
  uVar11 = -(uint)(fVar12 <= pIVar3->LineMaxY);
  local_68 = (float)(~uVar11 & (uint)fVar12 | (uint)pIVar3->LineMaxY & uVar11);
  pIVar3->LineMaxY = local_68;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0;
  (pIVar2->DC).CursorPos.y = local_68;
  if ((local_a4 & 0x10) == 0) {
    (pIVar2->DC).CursorMaxPos.x = pIVar3->HostCursorMaxPosX;
  }
  if ((((local_a4 & 1) == 0) && (pIVar2->SkipItems == false)) && (1 < pIVar3->Count)) {
    fVar12 = (pIVar2->ClipRect).Min.y;
    uVar11 = -(uint)(fVar12 <= pIVar3->HostCursorPosY);
    fVar14 = (pIVar2->ClipRect).Max.y;
    if (fVar14 <= local_68) {
      local_68 = fVar14;
    }
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_58 = (float)(~uVar11 & (uint)fVar12 | (uint)pIVar3->HostCursorPosY & uVar11);
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_8c = local_58 + 1.0;
    local_a0 = 0xffffffff;
    uVar10 = 1;
    lVar9 = 0;
    do {
      pIVar4 = (GImGui->CurrentWindow->DC).CurrentColumns;
      if (pIVar4 == (ImGuiOldColumns *)0x0) {
        auVar13 = ZEXT812(0);
      }
      else {
        auVar13._4_8_ = 0;
        auVar13._0_4_ =
             (pIVar4->OffMaxX - pIVar4->OffMinX) *
             *(float *)((long)&(pIVar4->Columns).Data[1].OffsetNorm + lVar9) + pIVar4->OffMinX;
      }
      pIVar5 = (pIVar3->Columns).Data;
      local_48._0_4_ = auVar13._0_4_ + (pIVar2->Pos).x;
      local_48._4_8_ = auVar13._4_8_;
      local_48._12_4_ = 0;
      id = pIVar3->ID + (int)uVar10;
      local_78.Max.x = (float)(int)(local_98->CurrentDpiScale * 4.0);
      local_78.Min.x = (float)local_48._0_4_ - local_78.Max.x;
      local_78.Max.x = local_78.Max.x + (float)local_48._0_4_;
      local_78.Min.y = local_58;
      local_78.Max.y = local_68;
      bVar7 = ItemAdd(&local_78,id,(ImRect *)0x0,2);
      if (bVar7) {
        local_a5 = false;
        local_a6 = false;
        if ((local_a4 & 2) == 0) {
          ButtonBehavior(&local_78,id,&local_a5,&local_a6,0);
          if (local_a5 == false) {
            if ((local_a6 & 1U) != 0) {
              local_98->MouseCursor = 4;
              goto LAB_001b6bde;
            }
          }
          else {
            local_98->MouseCursor = 4;
            if ((local_a6 & 1U) != 0) {
LAB_001b6bde:
              if ((*(byte *)((long)&pIVar5[1].Flags + lVar9) & 2) == 0) {
                local_a0 = uVar10;
              }
              local_a0 = local_a0 & 0xffffffff;
            }
          }
        }
        idx = local_a5 + 0x1b;
        if ((local_a6 & 1U) != 0) {
          idx = 0x1d;
        }
        col = GetColorU32(idx,1.0);
        local_88.x = (float)(int)(float)local_48._0_4_;
        local_80.y = local_8c;
        local_88.y = local_68;
        local_80.x = local_88.x;
        ImDrawList::AddLine(pIVar2->DrawList,&local_80,&local_88,col,1.0);
      }
      uVar10 = uVar10 + 1;
      uVar11 = pIVar3->Count;
      lVar9 = lVar9 + 0x1c;
    } while ((long)uVar10 < (long)(int)uVar11);
    column_index = (int)local_a0;
    if (column_index != -1) {
      if ((-1 < (int)uVar11) && (pIVar3->IsBeingResized == false)) {
        pIVar5 = (pIVar3->Columns).Data;
        lVar9 = 0;
        do {
          *(undefined4 *)((long)&pIVar5->OffsetNormBeforeResize + lVar9) =
               *(undefined4 *)((long)&pIVar5->OffsetNorm + lVar9);
          lVar9 = lVar9 + 0x1c;
        } while ((ulong)uVar11 * 0x1c + 0x1c != lVar9);
      }
      pIVar3->IsBeingResized = true;
      fVar12 = ((float)(int)(GImGui->CurrentDpiScale * 4.0) +
               ((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x)) -
               (GImGui->CurrentWindow->Pos).x;
      pIVar4 = (GImGui->CurrentWindow->DC).CurrentColumns;
      if (pIVar4 == (ImGuiOldColumns *)0x0) {
        fVar14 = 0.0;
      }
      else {
        if (column_index < 1) {
          iVar8 = pIVar4->Current;
        }
        else {
          iVar8 = column_index + -1;
        }
        fVar14 = (pIVar4->OffMaxX - pIVar4->OffMinX) * (pIVar4->Columns).Data[iVar8].OffsetNorm +
                 pIVar4->OffMinX;
      }
      fVar1 = (GImGui->Style).ColumnsMinSpacing;
      fVar14 = fVar14 + fVar1;
      uVar11 = -(uint)(fVar14 <= fVar12);
      fVar12 = (float)(uVar11 & (uint)fVar12 | ~uVar11 & (uint)fVar14);
      if ((pIVar3->Flags & 4) != 0) {
        if (pIVar4 == (ImGuiOldColumns *)0x0) {
          fVar14 = 0.0;
        }
        else {
          if (column_index < -1) {
            iVar8 = pIVar4->Current;
          }
          else {
            iVar8 = column_index + 1;
          }
          fVar14 = (pIVar4->OffMaxX - pIVar4->OffMinX) * (pIVar4->Columns).Data[iVar8].OffsetNorm +
                   pIVar4->OffMinX;
        }
        fVar14 = fVar14 - fVar1;
        if (fVar14 <= fVar12) {
          fVar12 = fVar14;
        }
      }
      bVar7 = column_index != -1;
      SetColumnOffset(column_index,fVar12);
      goto LAB_001b6d1b;
    }
  }
  bVar7 = false;
LAB_001b6d1b:
  pIVar3->IsBeingResized = bVar7;
  IVar6 = (pIVar2->ParentWorkRect).Max;
  (pIVar2->WorkRect).Min = (pIVar2->ParentWorkRect).Min;
  (pIVar2->WorkRect).Max = IVar6;
  IVar6 = (pIVar3->HostBackupParentWorkRect).Max;
  (pIVar2->ParentWorkRect).Min = (pIVar3->HostBackupParentWorkRect).Min;
  (pIVar2->ParentWorkRect).Max = IVar6;
  (pIVar2->DC).CurrentColumns = (ImGuiOldColumns *)0x0;
  (pIVar2->DC).ColumnsOffset.x = 0.0;
  (pIVar2->DC).CursorPos.x = (float)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + 0.0);
  NavUpdateCurrentWindowIsScrollPushableX();
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        columns->Splitter.Merge(window->DrawList);
    }

    const ImGuiOldColumnFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiOldColumnFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiOldColumnFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiOldColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = ImTrunc(COLUMNS_HIT_RECT_HALF_THICKNESS * g.CurrentDpiScale);
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            if (!ItemAdd(column_hit_rect, column_id, NULL, ImGuiItemFlags_NoNav))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiOldColumnFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiOldColumnFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_TRUNC(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = window->ParentWorkRect;
    window->ParentWorkRect = columns->HostBackupParentWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_TRUNC(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    NavUpdateCurrentWindowIsScrollPushableX();
}